

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralLinearActionVarying::IfcStructuralLinearActionVarying
          (IfcStructuralLinearActionVarying *this)

{
  IfcStructuralLinearActionVarying *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x1d8,"IfcStructuralLinearActionVarying");
  IfcStructuralLinearAction::IfcStructuralLinearAction
            (&this->super_IfcStructuralLinearAction,&PTR_construction_vtable_24__00f9cc48);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralLinearActionVarying,_2UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralLinearActionVarying,_2UL> *)
             &(this->super_IfcStructuralLinearAction).field_0x1a8,
             &PTR_construction_vtable_24__00f9cdd0);
  *(undefined8 *)
   &(this->super_IfcStructuralLinearAction).super_IfcStructuralAction.super_IfcStructuralActivity.
    super_IfcProduct.super_IfcObject = 0xf9caf0;
  *(undefined8 *)&this->field_0x1d8 = 0xf9cc30;
  *(undefined8 *)
   &(this->super_IfcStructuralLinearAction).super_IfcStructuralAction.super_IfcStructuralActivity.
    super_IfcProduct.super_IfcObject.field_0x88 = 0xf9cb18;
  (this->super_IfcStructuralLinearAction).super_IfcStructuralAction.super_IfcStructuralActivity.
  super_IfcProduct.super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)0xf9cb40;
  *(undefined8 *)
   &(this->super_IfcStructuralLinearAction).super_IfcStructuralAction.super_IfcStructuralActivity.
    super_IfcProduct.super_IfcObject.field_0xd0 = 0xf9cb68;
  *(undefined8 *)
   &(this->super_IfcStructuralLinearAction).super_IfcStructuralAction.super_IfcStructuralActivity.
    super_IfcProduct.field_0x100 = 0xf9cb90;
  *(undefined8 *)
   &(this->super_IfcStructuralLinearAction).super_IfcStructuralAction.super_IfcStructuralActivity.
    field_0x138 = 0xf9cbb8;
  *(undefined8 *)&(this->super_IfcStructuralLinearAction).super_IfcStructuralAction.field_0x178 =
       0xf9cbe0;
  *(undefined8 *)&(this->super_IfcStructuralLinearAction).field_0x1a8 = 0xf9cc08;
  STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>::Lazy
            ((Lazy<Assimp::IFC::Schema_2x3::NotImplemented> *)
             &(this->super_IfcStructuralLinearAction).field_0x1b8,(LazyObject *)0x0);
  STEP::ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_1UL,_0UL>::ListOf
            (&this->SubsequentAppliedLoads);
  return;
}

Assistant:

IfcStructuralLinearActionVarying() : Object("IfcStructuralLinearActionVarying") {}